

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O0

void prf_header_entry_f(prf_node_t *node,prf_state_t *state)

{
  void *pvVar1;
  long *in_RSI;
  ushort *in_RDI;
  node_data_conflict3 *data;
  undefined8 in_stack_ffffffffffffffe8;
  
  if (*in_RDI == prf_header_info.opcode) {
    if ((in_RSI[2] == 0) || ((ushort *)in_RSI[2] == in_RDI)) {
      in_RSI[2] = (long)in_RDI;
      pvVar1 = prf_array_set_count(in_RSI,(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
      in_RSI[6] = (long)pvVar1;
      if (*in_RSI == 0) {
        prf_error(9,"model is ");
      }
      else {
        *(short *)(*in_RSI + 0x20) = (short)*(undefined4 *)(*(long *)(in_RDI + 4) + 8);
      }
    }
    else {
      prf_error(9,"header entry: a header node is already registered");
    }
  }
  else {
    prf_error(9,"header entry state method tried on node of type %d.",(ulong)*in_RDI);
  }
  return;
}

Assistant:

static
void
prf_header_entry_f(
    prf_node_t * node,
    prf_state_t * state )
{
    assert( node != NULL && state != NULL );

    if ( node->opcode != prf_header_info.opcode ) {
        prf_error( 9, "header entry state method tried on node of type %d.",
            node->opcode );
        return;
    }

    if ( state->header != NULL && state->header != node ) {
        prf_error( 9, "header entry: a header node is already registered" );
        return;
    }


    state->header = node;
    state->materials = (prf_node_t **)prf_array_set_count( state->materials,0);

    if ( state->model == NULL ) {
        prf_error( 9, "model is " );
    } else {
        node_data * data;
        data = (node_data *) node->data;
        state->model->ofversion = data->format_revision_level;
    }

}